

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::layout_for_variable_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  ExecutionModel EVar3;
  uint *puVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  CompilerError *pCVar7;
  char *pcVar8;
  char *in_RCX;
  CompilerGLSL *ts_1;
  bool local_89a;
  bool local_899;
  bool local_898;
  bool local_896;
  byte local_895;
  bool local_893;
  bool local_892;
  bool local_891;
  string local_6a8;
  allocator local_682;
  undefined1 local_681;
  undefined4 local_680;
  allocator local_67a;
  allocator local_679;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  char *local_658;
  char *fmt;
  string local_630;
  uint32_t local_610;
  uint32_t local_60c;
  string local_608;
  uint32_t local_5e8;
  uint32_t local_5e4;
  string local_5e0;
  bool local_5be;
  bool local_5bd;
  bool local_5bc;
  byte local_5bb;
  bool local_5ba;
  bool local_5b9;
  bool can_use_binding;
  ID IStack_5b8;
  bool can_use_buffer_blocks;
  bool ubo_block;
  bool emulated_ubo;
  bool ssbo_block;
  bool push_constant_block;
  string local_5b0;
  uint32_t local_590;
  uint32_t local_58c;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  uint32_t local_518;
  uint32_t local_514;
  string local_510;
  uint32_t local_4f0;
  uint32_t local_4ec;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  uint32_t local_4a0;
  uint32_t local_49c;
  string local_498;
  uint32_t local_478;
  uint32_t local_474;
  string local_470;
  uint32_t local_450;
  uint32_t local_44c;
  string local_448;
  uint32_t local_428;
  uint32_t local_424;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  uint32_t local_398;
  uint32_t local_394;
  uint32_t local_390;
  uint32_t stride;
  uint32_t local_388;
  uint32_t local_384;
  uint32_t buffer_index;
  uint32_t local_37c;
  uint32_t local_378;
  uint32_t local_374;
  uint32_t member_geom_stream;
  uint32_t local_36c;
  uint32_t i_1;
  uint32_t local_364;
  uint32_t local_360;
  uint32_t local_35c;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  bool have_geom_stream;
  bool have_any_xfb_offset;
  bool have_xfb_buffer_stride;
  uint32_t member_count;
  bool uses_enhanced_layouts;
  uint32_t local_324;
  uint32_t local_320;
  uint32_t local_31c;
  string local_318;
  Bitset local_2f8;
  uint local_2b4;
  undefined1 local_2b0 [4];
  uint32_t i;
  Bitset combined_decoration;
  uint32_t uStack_264;
  bool is_block;
  string local_260;
  allocator local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  uint32_t local_174;
  Bitset *local_170;
  Bitset *typeflags;
  Bitset *local_160;
  Bitset *flags;
  SPIRType *type;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  allocator local_21;
  SPIRVariable *local_20;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_20 = var;
  var_local = (SPIRVariable *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar1 = is_legacy(this);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_20->super_IVariant).self);
    bVar1 = subpass_input_is_framebuffer_fetch(this,uVar2);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",
                 (allocator *)(attr.stack_storage.aligned_char + 0xfb));
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(attr.stack_storage.aligned_char + 0xfb));
    }
    else {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type);
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(local_20->super_IVariant).field_0xc);
      flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      typeflags._4_4_ = (local_20->super_IVariant).self.id;
      local_160 = Compiler::get_decoration_bitset(&this->super_Compiler,typeflags._4_4_);
      local_174 = *(uint32_t *)&(flags->higher)._M_h._M_buckets;
      local_170 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_174);
      bVar1 = Bitset::get(local_160,0x1482);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_198,"passthrough",&local_199);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_198);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
      }
      if ((((this->options).vulkan_semantics & 1U) == 0) || (local_20->storage != PushConstant)) {
        if (local_20->storage == ShaderRecordBufferKHR) {
          in_RCX = "shaderRecordEXT";
          pcVar8 = "shaderRecordNV";
          if ((this->ray_tracing_is_khr & 1U) != 0) {
            pcVar8 = "shaderRecordEXT";
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1e8,pcVar8,&local_1e9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,&local_1e8);
          ::std::__cxx11::string::~string((string *)&local_1e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1c0,"push_constant",&local_1c1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      bVar1 = Bitset::get(local_160,4);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_210,"row_major",&local_211);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_210);
        ::std::__cxx11::string::~string((string *)&local_210);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
      bVar1 = Bitset::get(local_160,5);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_238,"column_major",&local_239);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_238);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      if ((((this->options).vulkan_semantics & 1U) != 0) &&
         (bVar1 = Bitset::get(local_160,0x2b), bVar1)) {
        uStack_264 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(local_20->super_IVariant).self.id,
                                DecorationInputAttachmentIndex);
        join<char_const(&)[26],unsigned_int>
                  (&local_260,(spirv_cross *)"input_attachment_index = ",
                   (char (*) [26])&stack0xfffffffffffffd9c,(uint *)in_RCX);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_260);
        ::std::__cxx11::string::~string((string *)&local_260);
      }
      combined_decoration.higher._M_h._M_single_bucket._0_4_ =
           *(uint32_t *)&(flags->higher)._M_h._M_buckets;
      combined_decoration.higher._M_h._M_single_bucket._7_1_ =
           Compiler::has_decoration
                     (&this->super_Compiler,combined_decoration.higher._M_h._M_single_bucket._0_4_,
                      Block);
      bVar1 = Bitset::get(local_160,0x1e);
      if ((bVar1) &&
         (bVar1 = can_use_io_location(this,local_20->storage,
                                      (bool)(combined_decoration.higher._M_h._M_single_bucket._7_1_
                                            & 1)), bVar1)) {
        Bitset::Bitset((Bitset *)local_2b0);
        local_2b4 = 0;
        while( true ) {
          puVar4 = (uint *)(ulong)local_2b4;
          pmVar5 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_Compiler).ir.meta,(key_type *)&flags->higher);
          in_RCX = (char *)VectorView<spirv_cross::Meta::Decoration>::size
                                     (&(pmVar5->members).
                                       super_VectorView<spirv_cross::Meta::Decoration>);
          if (in_RCX <= puVar4) break;
          Compiler::combined_decoration_for_member
                    (&local_2f8,&this->super_Compiler,(SPIRType *)flags,local_2b4);
          Bitset::merge_or((Bitset *)local_2b0,&local_2f8);
          Bitset::~Bitset(&local_2f8);
          local_2b4 = local_2b4 + 1;
        }
        bVar1 = Bitset::get((Bitset *)local_2b0,0x1e);
        if (!bVar1) {
          local_320 = (local_20->super_IVariant).self.id;
          local_31c = Compiler::get_decoration
                                (&this->super_Compiler,(ID)local_320,DecorationLocation);
          join<char_const(&)[12],unsigned_int>
                    (&local_318,(spirv_cross *)"location = ",(char (*) [12])&local_31c,
                     (uint *)in_RCX);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,&local_318);
          ::std::__cxx11::string::~string((string *)&local_318);
        }
        Bitset::~Bitset((Bitset *)local_2b0);
      }
      EVar3 = Compiler::get_execution_model(&this->super_Compiler);
      if ((EVar3 == ExecutionModelFragment) && (local_20->storage == Output)) {
        local_324 = (local_20->super_IVariant).self.id;
        uVar2 = Compiler::get_decoration(&this->super_Compiler,(ID)local_324,DecorationLocation);
        bVar1 = location_is_non_coherent_framebuffer_fetch(this,uVar2);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&member_count,"noncoherent",(allocator *)&have_xfb_buffer_stride);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &member_count);
          ::std::__cxx11::string::~string((string *)&member_count);
          ::std::allocator<char>::~allocator((allocator<char> *)&have_xfb_buffer_stride);
        }
      }
      have_any_xfb_offset = false;
      if (((combined_decoration.higher._M_h._M_single_bucket._7_1_ & 1) == 0) ||
         (local_20->storage != Output)) {
        if (local_20->storage == Output) {
          bVar1 = Bitset::get(local_160,0x24);
          if (((bVar1) && (bVar1 = Bitset::get(local_160,0x25), bVar1)) &&
             (bVar1 = Bitset::get(local_160,0x23), bVar1)) {
            local_450 = (local_20->super_IVariant).self.id;
            local_44c = Compiler::get_decoration
                                  (&this->super_Compiler,(ID)local_450,DecorationXfbBuffer);
            join<char_const(&)[14],unsigned_int>
                      (&local_448,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_44c,
                       (uint *)in_RCX);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,&local_448);
            ::std::__cxx11::string::~string((string *)&local_448);
            local_478 = (local_20->super_IVariant).self.id;
            local_474 = Compiler::get_decoration
                                  (&this->super_Compiler,(ID)local_478,DecorationXfbStride);
            join<char_const(&)[14],unsigned_int>
                      (&local_470,(spirv_cross *)0x5b11fc,(char (*) [14])&local_474,(uint *)in_RCX);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,&local_470);
            ::std::__cxx11::string::~string((string *)&local_470);
            local_4a0 = (local_20->super_IVariant).self.id;
            local_49c = Compiler::get_decoration
                                  (&this->super_Compiler,(ID)local_4a0,DecorationOffset);
            join<char_const(&)[14],unsigned_int>
                      (&local_498,(spirv_cross *)0x5b1260,(char (*) [14])&local_49c,(uint *)in_RCX);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,&local_498);
            ::std::__cxx11::string::~string((string *)&local_498);
            have_any_xfb_offset = true;
          }
          bVar1 = Bitset::get(local_160,0x1d);
          if (bVar1) {
            EVar3 = Compiler::get_execution_model(&this->super_Compiler);
            if (EVar3 != ExecutionModelGeometry) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar7,"Geometry streams can only be used in geometry shaders.");
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if (((this->options).es & 1U) != 0) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar7,"Multiple geometry streams not supported in ESSL.");
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if ((this->options).version < 400) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_4c0,"GL_ARB_transform_feedback3",&local_4c1);
              require_extension_internal(this,&local_4c0);
              ::std::__cxx11::string::~string((string *)&local_4c0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
            }
            local_4f0 = (local_20->super_IVariant).self.id;
            local_4ec = Compiler::get_decoration
                                  (&this->super_Compiler,(ID)local_4f0,DecorationStream);
            join<char_const(&)[10],unsigned_int>
                      (&local_4e8,(spirv_cross *)"stream = ",(char (*) [10])&local_4ec,
                       (uint *)in_RCX);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,&local_4e8);
            ::std::__cxx11::string::~string((string *)&local_4e8);
          }
        }
      }
      else {
        sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                           &flags[2].higher._M_h._M_before_begin);
        xfb_stride = (uint32_t)sVar6;
        xfb_buffer._3_1_ = 0;
        xfb_buffer._2_1_ = 0;
        xfb_buffer._1_1_ = 0;
        geom_stream = 0;
        local_35c = 0;
        local_360 = 0;
        bVar1 = Bitset::get(local_160,0x24);
        if ((bVar1) && (bVar1 = Bitset::get(local_160,0x25), bVar1)) {
          xfb_buffer._3_1_ = 1;
          local_364 = (local_20->super_IVariant).self.id;
          local_35c = Compiler::get_decoration
                                (&this->super_Compiler,(ID)local_364,DecorationXfbBuffer);
          i_1 = (local_20->super_IVariant).self.id;
          geom_stream = Compiler::get_decoration(&this->super_Compiler,(ID)i_1,DecorationXfbStride);
        }
        bVar1 = Bitset::get(local_160,0x1d);
        if (bVar1) {
          xfb_buffer._1_1_ = 1;
          local_36c = (local_20->super_IVariant).self.id;
          local_360 = Compiler::get_decoration(&this->super_Compiler,(ID)local_36c,DecorationStream)
          ;
        }
        for (member_geom_stream = 0; member_geom_stream < xfb_stride;
            member_geom_stream = member_geom_stream + 1) {
          local_374 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
          bVar1 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)local_374,member_geom_stream,
                             DecorationStream);
          if (bVar1) {
            local_37c = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            local_378 = Compiler::get_member_decoration
                                  (&this->super_Compiler,(TypeID)local_37c,member_geom_stream,
                                   DecorationStream);
            if (((xfb_buffer._1_1_ & 1) != 0) && (local_378 != local_360)) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar7,"IO block member Stream mismatch.");
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            xfb_buffer._1_1_ = 1;
            local_360 = local_378;
          }
          buffer_index = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
          in_RCX = (char *)0x23;
          bVar1 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)buffer_index,member_geom_stream,
                             DecorationOffset);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            xfb_buffer._2_1_ = 1;
            local_384 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            bVar1 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)local_384,member_geom_stream,
                               DecorationXfbBuffer);
            if (bVar1) {
              stride = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
              local_388 = Compiler::get_member_decoration
                                    (&this->super_Compiler,(TypeID)stride,member_geom_stream,
                                     DecorationXfbBuffer);
              if (((xfb_buffer._3_1_ & 1) != 0) && (local_388 != local_35c)) {
                pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(pCVar7,"IO block member XfbBuffer mismatch.");
                __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              xfb_buffer._3_1_ = 1;
              local_35c = local_388;
            }
            local_390 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            in_RCX = (char *)0x25;
            bVar1 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)local_390,member_geom_stream,
                               DecorationXfbStride);
            if (bVar1) {
              local_398 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
              in_RCX = (char *)0x25;
              local_394 = Compiler::get_member_decoration
                                    (&this->super_Compiler,(TypeID)local_398,member_geom_stream,
                                     DecorationXfbStride);
              if (((xfb_buffer._3_1_ & 1) != 0) && (local_394 != geom_stream)) {
                pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(pCVar7,"IO block member XfbStride mismatch.");
                __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              xfb_buffer._3_1_ = 1;
              geom_stream = local_394;
            }
          }
        }
        if (((xfb_buffer._3_1_ & 1) != 0) && ((xfb_buffer._2_1_ & 1) != 0)) {
          join<char_const(&)[14],unsigned_int&>
                    (&local_3b8,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_35c,
                     (uint *)in_RCX);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,&local_3b8);
          ::std::__cxx11::string::~string((string *)&local_3b8);
          join<char_const(&)[14],unsigned_int&>
                    (&local_3d8,(spirv_cross *)0x5b11fc,(char (*) [14])&geom_stream,(uint *)in_RCX);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,&local_3d8);
          ::std::__cxx11::string::~string((string *)&local_3d8);
          have_any_xfb_offset = true;
        }
        if ((xfb_buffer._1_1_ & 1) != 0) {
          EVar3 = Compiler::get_execution_model(&this->super_Compiler);
          if (EVar3 != ExecutionModelGeometry) {
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar7,"Geometry streams can only be used in geometry shaders.");
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((this->options).es & 1U) != 0) {
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar7,"Multiple geometry streams not supported in ESSL.");
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((this->options).version < 400) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3f8,"GL_ARB_transform_feedback3",&local_3f9);
            require_extension_internal(this,&local_3f8);
            ::std::__cxx11::string::~string((string *)&local_3f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          }
          local_428 = (local_20->super_IVariant).self.id;
          local_424 = Compiler::get_decoration(&this->super_Compiler,(ID)local_428,DecorationStream)
          ;
          join<char_const(&)[10],unsigned_int>
                    (&local_420,(spirv_cross *)"stream = ",(char (*) [10])&local_424,(uint *)in_RCX)
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,&local_420);
          ::std::__cxx11::string::~string((string *)&local_420);
        }
      }
      bVar1 = Bitset::get(local_160,0x1f);
      if ((bVar1) &&
         (bVar1 = can_use_io_location(this,local_20->storage,
                                      (bool)(combined_decoration.higher._M_h._M_single_bucket._7_1_
                                            & 1)), bVar1)) {
        have_any_xfb_offset = true;
        local_518 = (local_20->super_IVariant).self.id;
        local_514 = Compiler::get_decoration(&this->super_Compiler,(ID)local_518,Component);
        join<char_const(&)[13],unsigned_int>
                  (&local_510,(spirv_cross *)"component = ",(char (*) [13])&local_514,(uint *)in_RCX
                  );
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_510);
        ::std::__cxx11::string::~string((string *)&local_510);
      }
      if ((have_any_xfb_offset & 1U) != 0) {
        if (((this->options).es & 1U) == 0) {
          if (((this->options).version < 0x1b8) && (0x8b < (this->options).version)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_538,"GL_ARB_enhanced_layouts",&local_539);
            require_extension_internal(this,&local_538);
            ::std::__cxx11::string::~string((string *)&local_538);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
          }
          else if ((this->options).version < 0x8c) {
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar7,"GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40."
                      );
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1b8)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_560,"GL_ARB_enhanced_layouts",&local_561);
            require_extension_internal(this,&local_560);
            ::std::__cxx11::string::~string((string *)&local_560);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
          }
        }
        else if (((this->options).es & 1U) != 0) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar7,"GL_ARB_enhanced_layouts is not supported in ESSL.");
          __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      bVar1 = Bitset::get(local_160,0x20);
      if (bVar1) {
        local_590 = (local_20->super_IVariant).self.id;
        local_58c = Compiler::get_decoration(&this->super_Compiler,(ID)local_590,DecorationIndex);
        join<char_const(&)[9],unsigned_int>
                  (&local_588,(spirv_cross *)0x5afea8,(char (*) [9])&local_58c,(uint *)in_RCX);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_588);
        ::std::__cxx11::string::~string((string *)&local_588);
      }
      if ((((local_20->storage != PushConstant) && (local_20->storage != ShaderRecordBufferKHR)) &&
          (bVar1 = Bitset::get(local_160,0x22), bVar1)) &&
         (((this->options).vulkan_semantics & 1U) != 0)) {
        IStack_5b8.id = (local_20->super_IVariant).self.id;
        _ubo_block = Compiler::get_decoration
                               (&this->super_Compiler,IStack_5b8,DecorationDescriptorSet);
        join<char_const(&)[7],unsigned_int>
                  (&local_5b0,(spirv_cross *)0x5b1267,(char (*) [7])&ubo_block,(uint *)in_RCX);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_5b0);
        ::std::__cxx11::string::~string((string *)&local_5b0);
      }
      local_891 = false;
      if (((this->options).vulkan_semantics & 1U) != 0) {
        local_891 = local_20->storage == PushConstant;
      }
      local_5b9 = local_891;
      local_892 = true;
      if ((local_20->storage != StorageBuffer) &&
         (local_892 = true, local_20->storage != ShaderRecordBufferKHR)) {
        local_893 = false;
        if (local_20->storage == StorageClassUniform) {
          local_893 = Bitset::get(local_170,3);
        }
        local_892 = local_893;
      }
      local_5ba = local_892;
      local_895 = 0;
      if (local_20->storage == PushConstant) {
        local_895 = (this->options).emit_push_constant_as_uniform_buffer;
      }
      local_5bb = local_895 & 1;
      local_896 = false;
      if (local_20->storage == StorageClassUniform) {
        local_896 = Bitset::get(local_170,2);
      }
      local_5bc = local_896;
      if ((((this->options).es & 1U) == 0) || (local_898 = true, (this->options).version < 300)) {
        local_899 = false;
        if (((this->options).es & 1U) == 0) {
          local_899 = 0x8b < (this->options).version;
        }
        local_898 = local_899;
      }
      local_5bd = local_898;
      if ((local_896 != false) &&
         (((this->options).emit_uniform_buffer_as_plain_uniforms & 1U) != 0)) {
        local_5bd = false;
      }
      if (((this->options).es & 1U) == 0) {
        local_89a = true;
        if (((this->options).enable_420pack_extension & 1U) == 0) {
          local_89a = 0x1a3 < (this->options).version;
        }
        local_5be = local_89a;
      }
      else {
        local_5be = 0x135 < (this->options).version;
      }
      if ((local_5bd == false) && (local_20->storage == StorageClassUniform)) {
        local_5be = false;
      }
      if (local_20->storage == ShaderRecordBufferKHR) {
        local_5be = false;
      }
      ts_1 = this;
      if ((local_5be != false) && (bVar1 = Bitset::get(local_160,0x21), bVar1)) {
        local_5e8 = (local_20->super_IVariant).self.id;
        local_5e4 = Compiler::get_decoration(&this->super_Compiler,(ID)local_5e8,Binding);
        join<char_const(&)[11],unsigned_int>
                  (&local_5e0,(spirv_cross *)"binding = ",(char (*) [11])&local_5e4,(uint *)ts_1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_5e0);
        ::std::__cxx11::string::~string((string *)&local_5e0);
      }
      if ((local_20->storage != Output) && (bVar1 = Bitset::get(local_160,0x23), bVar1)) {
        local_610 = (local_20->super_IVariant).self.id;
        local_60c = Compiler::get_decoration(&this->super_Compiler,(ID)local_610,DecorationOffset);
        join<char_const(&)[10],unsigned_int>
                  (&local_608,(spirv_cross *)0x5b1264,(char (*) [10])&local_60c,(uint *)ts_1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_608);
        ::std::__cxx11::string::~string((string *)&local_608);
      }
      if (((local_5bd & 1U) == 0) || (((local_5bc & 1U) == 0 && ((local_5bb & 1) == 0)))) {
        if (((local_5bd & 1U) != 0) && (((local_5b9 & 1U) != 0 || ((local_5ba & 1U) != 0)))) {
          buffer_to_packing_standard_abi_cxx11_((string *)&fmt,this,(SPIRType *)flags,true,true);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fmt);
          ::std::__cxx11::string::~string((string *)&fmt);
        }
      }
      else {
        buffer_to_packing_standard_abi_cxx11_(&local_630,this,(SPIRType *)flags,false,true);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_630);
        ::std::__cxx11::string::~string((string *)&local_630);
      }
      if ((((int)(flags->higher)._M_h._M_bucket_count == 0x10) &&
          (*(int *)((long)&flags[4].higher._M_h._M_bucket_count + 4) == 2)) &&
         (pcVar8 = format_to_glsl(this,*(ImageFormat *)&flags[4].higher._M_h._M_before_begin._M_nxt)
         , local_658 = pcVar8, pcVar8 != (char *)0x0)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_678,pcVar8,&local_679);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,&local_678);
        ::std::__cxx11::string::~string((string *)&local_678);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_679);
      }
      bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&type);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_67a);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_67a);
      }
      else {
        local_681 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"layout(",&local_682);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_682);
        merge(&local_6a8,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)&type,", ");
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6a8);
        ::std::__cxx11::string::~string((string *)&local_6a8);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,") ");
        local_681 = 1;
      }
      local_680 = 1;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)&type);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::layout_for_variable(const SPIRVariable &var)
{
	// FIXME: Come up with a better solution for when to disable layouts.
	// Having layouts depend on extensions as well as which types
	// of layouts are used. For now, the simple solution is to just disable
	// layouts for legacy versions.
	if (is_legacy())
		return "";

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	SmallVector<string> attr;

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = get_decoration_bitset(var.self);
	auto &typeflags = get_decoration_bitset(type.self);

	if (flags.get(DecorationPassthroughNV))
		attr.push_back("passthrough");

	if (options.vulkan_semantics && var.storage == StorageClassPushConstant)
		attr.push_back("push_constant");
	else if (var.storage == StorageClassShaderRecordBufferKHR)
		attr.push_back(ray_tracing_is_khr ? "shaderRecordEXT" : "shaderRecordNV");

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	if (flags.get(DecorationColMajor))
		attr.push_back("column_major");

	if (options.vulkan_semantics)
	{
		if (flags.get(DecorationInputAttachmentIndex))
			attr.push_back(join("input_attachment_index = ", get_decoration(var.self, DecorationInputAttachmentIndex)));
	}

	bool is_block = has_decoration(type.self, DecorationBlock);
	if (flags.get(DecorationLocation) && can_use_io_location(var.storage, is_block))
	{
		Bitset combined_decoration;
		for (uint32_t i = 0; i < ir.meta[type.self].members.size(); i++)
			combined_decoration.merge_or(combined_decoration_for_member(type, i));

		// If our members have location decorations, we don't need to
		// emit location decorations at the top as well (looks weird).
		if (!combined_decoration.get(DecorationLocation))
			attr.push_back(join("location = ", get_decoration(var.self, DecorationLocation)));
	}

	if (get_execution_model() == ExecutionModelFragment && var.storage == StorageClassOutput &&
	    location_is_non_coherent_framebuffer_fetch(get_decoration(var.self, DecorationLocation)))
	{
		attr.push_back("noncoherent");
	}

	// Transform feedback
	bool uses_enhanced_layouts = false;
	if (is_block && var.storage == StorageClassOutput)
	{
		// For blocks, there is a restriction where xfb_stride/xfb_buffer must only be declared on the block itself,
		// since all members must match the same xfb_buffer. The only thing we will declare for members of the block
		// is the xfb_offset.
		uint32_t member_count = uint32_t(type.member_types.size());
		bool have_xfb_buffer_stride = false;
		bool have_any_xfb_offset = false;
		bool have_geom_stream = false;
		uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;

		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride))
		{
			have_xfb_buffer_stride = true;
			xfb_buffer = get_decoration(var.self, DecorationXfbBuffer);
			xfb_stride = get_decoration(var.self, DecorationXfbStride);
		}

		if (flags.get(DecorationStream))
		{
			have_geom_stream = true;
			geom_stream = get_decoration(var.self, DecorationStream);
		}

		// Verify that none of the members violate our assumption.
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationStream))
			{
				uint32_t member_geom_stream = get_member_decoration(type.self, i, DecorationStream);
				if (have_geom_stream && member_geom_stream != geom_stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = member_geom_stream;
			}

			// Only members with an Offset decoration participate in XFB.
			if (!has_member_decoration(type.self, i, DecorationOffset))
				continue;
			have_any_xfb_offset = true;

			if (has_member_decoration(type.self, i, DecorationXfbBuffer))
			{
				uint32_t buffer_index = get_member_decoration(type.self, i, DecorationXfbBuffer);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
			}

			if (has_member_decoration(type.self, i, DecorationXfbStride))
			{
				uint32_t stride = get_member_decoration(type.self, i, DecorationXfbStride);
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbStride mismatch.");
				have_xfb_buffer_stride = true;
				xfb_stride = stride;
			}
		}

		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			attr.push_back(join("xfb_buffer = ", xfb_buffer));
			attr.push_back(join("xfb_stride = ", xfb_stride));
			uses_enhanced_layouts = true;
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}
	else if (var.storage == StorageClassOutput)
	{
		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride) && flags.get(DecorationOffset))
		{
			// XFB for standalone variables, we can emit all decorations.
			attr.push_back(join("xfb_buffer = ", get_decoration(var.self, DecorationXfbBuffer)));
			attr.push_back(join("xfb_stride = ", get_decoration(var.self, DecorationXfbStride)));
			attr.push_back(join("xfb_offset = ", get_decoration(var.self, DecorationOffset)));
			uses_enhanced_layouts = true;
		}

		if (flags.get(DecorationStream))
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}

	// Can only declare Component if we can declare location.
	if (flags.get(DecorationComponent) && can_use_io_location(var.storage, is_block))
	{
		uses_enhanced_layouts = true;
		attr.push_back(join("component = ", get_decoration(var.self, DecorationComponent)));
	}

	if (uses_enhanced_layouts)
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.");
			if (!options.es && options.version < 440)
				require_extension_internal("GL_ARB_enhanced_layouts");
		}
		else if (options.es)
			SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in ESSL.");
	}

	if (flags.get(DecorationIndex))
		attr.push_back(join("index = ", get_decoration(var.self, DecorationIndex)));

	// Do not emit set = decoration in regular GLSL output, but
	// we need to preserve it in Vulkan GLSL mode.
	if (var.storage != StorageClassPushConstant && var.storage != StorageClassShaderRecordBufferKHR)
	{
		if (flags.get(DecorationDescriptorSet) && options.vulkan_semantics)
			attr.push_back(join("set = ", get_decoration(var.self, DecorationDescriptorSet)));
	}

	bool push_constant_block = options.vulkan_semantics && var.storage == StorageClassPushConstant;
	bool ssbo_block = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	                  (var.storage == StorageClassUniform && typeflags.get(DecorationBufferBlock));
	bool emulated_ubo = var.storage == StorageClassPushConstant && options.emit_push_constant_as_uniform_buffer;
	bool ubo_block = var.storage == StorageClassUniform && typeflags.get(DecorationBlock);

	// GL 3.0/GLSL 1.30 is not considered legacy, but it doesn't have UBOs ...
	bool can_use_buffer_blocks = (options.es && options.version >= 300) || (!options.es && options.version >= 140);

	// pretend no UBOs when options say so
	if (ubo_block && options.emit_uniform_buffer_as_plain_uniforms)
		can_use_buffer_blocks = false;

	bool can_use_binding;
	if (options.es)
		can_use_binding = options.version >= 310;
	else
		can_use_binding = options.enable_420pack_extension || (options.version >= 420);

	// Make sure we don't emit binding layout for a classic uniform on GLSL 1.30.
	if (!can_use_buffer_blocks && var.storage == StorageClassUniform)
		can_use_binding = false;

	if (var.storage == StorageClassShaderRecordBufferKHR)
		can_use_binding = false;

	if (can_use_binding && flags.get(DecorationBinding))
		attr.push_back(join("binding = ", get_decoration(var.self, DecorationBinding)));

	if (var.storage != StorageClassOutput && flags.get(DecorationOffset))
		attr.push_back(join("offset = ", get_decoration(var.self, DecorationOffset)));

	// Instead of adding explicit offsets for every element here, just assume we're using std140 or std430.
	// If SPIR-V does not comply with either layout, we cannot really work around it.
	if (can_use_buffer_blocks && (ubo_block || emulated_ubo))
	{
		attr.push_back(buffer_to_packing_standard(type, false, true));
	}
	else if (can_use_buffer_blocks && (push_constant_block || ssbo_block))
	{
		attr.push_back(buffer_to_packing_standard(type, true, true));
	}

	// For images, the type itself adds a layout qualifer.
	// Only emit the format for storage images.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2)
	{
		const char *fmt = format_to_glsl(type.image.format);
		if (fmt)
			attr.push_back(fmt);
	}

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}